

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr * pcacheMergeDirtyList(PgHdr *pA,PgHdr *pB)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr result;
  
  pPVar3 = &result;
  do {
    pPVar4 = pA;
    uVar2 = pPVar4->pgno;
    while (pB->pgno <= uVar2) {
      pPVar3->pDirty = pB;
      ppPVar1 = &pB->pDirty;
      pPVar3 = pB;
      pB = *ppPVar1;
      if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0015f3b6;
    }
    pPVar3->pDirty = pPVar4;
    ppPVar1 = &pPVar4->pDirty;
    pPVar3 = pPVar4;
    pPVar4 = pB;
    pA = *ppPVar1;
  } while (*ppPVar1 != (PgHdr *)0x0);
LAB_0015f3b6:
  pPVar3->pDirty = pPVar4;
  return result.pDirty;
}

Assistant:

static PgHdr *pcacheMergeDirtyList(PgHdr *pA, PgHdr *pB){
  PgHdr result, *pTail;
  pTail = &result;
  assert( pA!=0 && pB!=0 );
  for(;;){
    if( pA->pgno<pB->pgno ){
      pTail->pDirty = pA;
      pTail = pA;
      pA = pA->pDirty;
      if( pA==0 ){
        pTail->pDirty = pB;
        break;
      }
    }else{
      pTail->pDirty = pB;
      pTail = pB;
      pB = pB->pDirty;
      if( pB==0 ){
        pTail->pDirty = pA;
        break;
      }
    }
  }
  return result.pDirty;
}